

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::CaptureNamedGroups(void)

{
  _Rb_tree_color _Var1;
  int iVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this;
  const_iterator cVar4;
  RE2 re;
  allocator local_271;
  LogMessageFatal local_270;
  RE2 local_f0;
  
  RE2::RE2(&local_f0,"(hello world)");
  iVar2 = RE2::NumberOfCapturingGroups(&local_f0);
  if (iVar2 != 1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x213);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (re.NumberOfCapturingGroups()) == (1)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  pmVar3 = RE2::NamedCapturingGroups_abi_cxx11_(&local_f0);
  if ((pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x215);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,"Check failed: (m.size()) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  RE2::~RE2(&local_f0);
  RE2::RE2(&local_f0,"(?P<A>expr(?P<B>expr)(?P<C>expr))((expr)(?P<D>expr))");
  iVar2 = RE2::NumberOfCapturingGroups(&local_f0);
  if (iVar2 != 6) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21a);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (re.NumberOfCapturingGroups()) == (6)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  this = &RE2::NamedCapturingGroups_abi_cxx11_(&local_f0)->_M_t;
  if ((this->_M_impl).super__Rb_tree_header._M_node_count != 4) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21c);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,"Check failed: (m.size()) == (4)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  std::__cxx11::string::string((string *)&local_270,"A",&local_271);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)&local_270);
  _Var1 = cVar4._M_node[2]._M_color;
  std::__cxx11::string::~string((string *)&local_270);
  if (_Var1 != _S_black) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21d);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (m.find(\"A\")->second) == (1)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  std::__cxx11::string::string((string *)&local_270,"B",&local_271);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)&local_270);
  _Var1 = cVar4._M_node[2]._M_color;
  std::__cxx11::string::~string((string *)&local_270);
  if (_Var1 != 2) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21e);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (m.find(\"B\")->second) == (2)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  std::__cxx11::string::string((string *)&local_270,"C",&local_271);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)&local_270);
  _Var1 = cVar4._M_node[2]._M_color;
  std::__cxx11::string::~string((string *)&local_270);
  if (_Var1 != 3) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21f);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (m.find(\"C\")->second) == (3)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  std::__cxx11::string::string((string *)&local_270,"D",&local_271);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)&local_270);
  _Var1 = cVar4._M_node[2]._M_color;
  std::__cxx11::string::~string((string *)&local_270);
  if (_Var1 != 6) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x220);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (m.find(\"D\")->second) == (6)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  RE2::~RE2(&local_f0);
  return;
}

Assistant:

TEST(Capture, NamedGroups) {
  {
    RE2 re("(hello world)");
    CHECK_EQ(re.NumberOfCapturingGroups(), 1);
    const map<string, int>& m = re.NamedCapturingGroups();
    CHECK_EQ(m.size(), 0);
  }

  {
    RE2 re("(?P<A>expr(?P<B>expr)(?P<C>expr))((expr)(?P<D>expr))");
    CHECK_EQ(re.NumberOfCapturingGroups(), 6);
    const map<string, int>& m = re.NamedCapturingGroups();
    CHECK_EQ(m.size(), 4);
    CHECK_EQ(m.find("A")->second, 1);
    CHECK_EQ(m.find("B")->second, 2);
    CHECK_EQ(m.find("C")->second, 3);
    CHECK_EQ(m.find("D")->second, 6);  // $4 and $5 are anonymous
  }
}